

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O2

void __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::~SignalTimeDependent
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this)

{
  ~SignalTimeDependent(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

virtual ~SignalTimeDependent() {}